

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t readback_part(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  void **ppvVar1;
  char *__dest;
  curl_off_t *pcVar2;
  size_t *psVar3;
  mimestate mVar4;
  bool bVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  curl_slist *pcVar9;
  ulong uVar10;
  size_t sVar11;
  ulong __n;
  size_t sVar12;
  bool bVar13;
  size_t local_58;
  char *local_50;
  
  if (bufsize == 0) {
    sVar11 = 0;
switchD_006e01eb_caseD_8:
    return sVar11;
  }
  ppvVar1 = &(part->state).ptr;
  __dest = (part->encstate).buf;
  sVar11 = 0;
LAB_006e01c5:
  mVar4 = (part->state).state;
  sVar12 = 0;
  if (MIMESTATE_END < mVar4) goto switchD_006e01eb_caseD_5;
  pcVar9 = (curl_slist *)(part->state).ptr;
  switch(mVar4) {
  case MIMESTATE_BEGIN:
    pcVar9 = part->curlheaders;
    (part->state).state = ((part->flags & 2) >> 1) * 3 + MIMESTATE_CURLHEADERS;
    (part->state).ptr = pcVar9;
    goto LAB_006e049c;
  case MIMESTATE_CURLHEADERS:
    if (pcVar9 == (curl_slist *)0x0) {
      pcVar9 = part->userheaders;
LAB_006e048d:
      (part->state).state = MIMESTATE_USERHEADERS;
    }
    else {
LAB_006e02b6:
      pcVar6 = pcVar9->data;
      sVar7 = strlen(pcVar6);
      sVar12 = curlx_sotouz((part->state).offset);
      uVar10 = sVar12 - sVar7;
      if (sVar12 < sVar7) {
        uVar10 = sVar7 - sVar12;
        pcVar6 = pcVar6 + sVar12;
LAB_006e0447:
        sVar12 = bufsize;
        if (uVar10 < bufsize) {
          sVar12 = uVar10;
        }
        memcpy(buffer,pcVar6,sVar12);
        pcVar2 = &(part->state).offset;
        *pcVar2 = *pcVar2 + sVar12;
        if (uVar10 != 0) break;
      }
      else if (uVar10 < 2) {
        pcVar6 = " \t\r\n" + uVar10 + 2;
        uVar10 = 2 - uVar10;
        goto LAB_006e0447;
      }
      pcVar9 = pcVar9->next;
    }
    (part->state).ptr = pcVar9;
LAB_006e049c:
    (part->state).offset = 0;
LAB_006e04a7:
    sVar12 = 0;
    break;
  case MIMESTATE_USERHEADERS:
    if (pcVar9 != (curl_slist *)0x0) {
      pcVar6 = match_header(pcVar9,"Content-Type",0xc);
      if (pcVar6 != (char *)0x0) {
        pcVar9 = pcVar9->next;
        goto LAB_006e048d;
      }
      goto LAB_006e02b6;
    }
    (part->state).state = MIMESTATE_EOH;
    goto LAB_006e0484;
  case MIMESTATE_EOH:
    sVar8 = curlx_sotouz((part->state).offset);
    if (1 < sVar8) {
      (part->state).state = MIMESTATE_BODY;
      goto LAB_006e0484;
    }
    sVar12 = 2 - sVar8;
    if (bufsize <= 2 - sVar8) {
      sVar12 = bufsize;
    }
    memcpy(buffer," \t\r\n" + sVar8 + 2,sVar12);
    pcVar2 = &(part->state).offset;
    *pcVar2 = *pcVar2 + sVar12;
    break;
  case MIMESTATE_BODY:
    (part->encstate).pos = 0;
    (part->encstate).bufbeg = 0;
    (part->encstate).bufend = 0;
    (part->state).state = MIMESTATE_CONTENT;
LAB_006e0484:
    *ppvVar1 = (void *)0x0;
    (part->state).offset = 0;
    goto LAB_006e04a7;
  case MIMESTATE_CONTENT:
    if (part->encoder != (mime_encoder *)0x0) {
      sVar12 = 0;
      bVar5 = false;
      local_58 = bufsize;
      local_50 = buffer;
      do {
        while( true ) {
          uVar10 = (part->encstate).bufbeg;
          bVar13 = (part->encstate).bufend <= uVar10;
          if (bVar13 && !bVar5) break;
          sVar8 = (*part->encoder->encodefunc)(local_50,local_58,(_Bool)(bVar13 | bVar5),part);
          if (sVar8 == 0) {
            if (!bVar13 && bVar5 == false) {
              uVar10 = (part->encstate).bufbeg;
              break;
            }
            goto LAB_006e04d8;
          }
          if (sVar8 + 2 < 2) goto LAB_006e0422;
          sVar12 = sVar12 + sVar8;
          local_50 = local_50 + sVar8;
          local_58 = local_58 - sVar8;
        }
        __n = (part->encstate).bufend;
        if (uVar10 != 0) {
          __n = __n - uVar10;
          if (__n != 0) {
            memmove(__dest,__dest + uVar10,__n);
          }
          (part->encstate).bufbeg = 0;
          (part->encstate).bufend = __n;
        }
        if (0xff < __n) {
          if (sVar12 != 0) goto LAB_006e04d8;
          sVar12 = 0xffffffffffffffff;
          goto LAB_006e0529;
        }
        sVar8 = read_part_content(part,__dest + __n,0x100 - __n,hasread);
        if ((sVar8 + 2 < 2) || (sVar8 - 0x10000000 < 2)) goto LAB_006e0422;
        if (sVar8 == 0) {
          bVar5 = true;
        }
        else {
          psVar3 = &(part->encstate).bufend;
          *psVar3 = *psVar3 + sVar8;
        }
      } while( true );
    }
    sVar12 = read_part_content(part,buffer,bufsize,hasread);
    goto LAB_006e04d8;
  case MIMESTATE_END:
    goto switchD_006e01eb_caseD_8;
  }
switchD_006e01eb_caseD_5:
  sVar11 = sVar11 + sVar12;
  buffer = buffer + sVar12;
  bufsize = bufsize - sVar12;
  if (bufsize == 0) {
    return sVar11;
  }
  goto LAB_006e01c5;
LAB_006e0422:
  if (sVar12 == 0) {
    sVar12 = sVar8;
  }
LAB_006e04d8:
  if ((1 < sVar12 + 2) && (1 < sVar12 - 0x10000000)) {
    if (sVar12 != 0) goto switchD_006e01eb_caseD_5;
    (part->state).state = MIMESTATE_END;
    *ppvVar1 = (void *)0x0;
    (part->state).offset = 0;
    if ((part->kind == MIMEKIND_FILE) && ((FILE *)part->fp != (FILE *)0x0)) {
      fclose((FILE *)part->fp);
      part->fp = (FILE *)0x0;
    }
    sVar12 = 0;
  }
LAB_006e0529:
  if (sVar11 != 0) {
    return sVar11;
  }
  return sVar12;
}

Assistant:

static size_t readback_part(curl_mimepart *part,
                            char *buffer, size_t bufsize, bool *hasread)
{
  size_t cursize = 0;

  /* Readback from part. */

  while(bufsize) {
    size_t sz = 0;
    struct curl_slist *hdr = (struct curl_slist *) part->state.ptr;
    switch(part->state.state) {
    case MIMESTATE_BEGIN:
      mimesetstate(&part->state,
                   (part->flags & MIME_BODY_ONLY)?
                     MIMESTATE_BODY: MIMESTATE_CURLHEADERS,
                   part->curlheaders);
      break;
    case MIMESTATE_USERHEADERS:
      if(!hdr) {
        mimesetstate(&part->state, MIMESTATE_EOH, NULL);
        break;
      }
      if(match_header(hdr, "Content-Type", 12)) {
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, hdr->next);
        break;
      }
      FALLTHROUGH();
    case MIMESTATE_CURLHEADERS:
      if(!hdr)
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, part->userheaders);
      else {
        sz = readback_bytes(&part->state, buffer, bufsize,
                            hdr->data, strlen(hdr->data), STRCONST("\r\n"));
        if(!sz)
          mimesetstate(&part->state, part->state.state, hdr->next);
      }
      break;
    case MIMESTATE_EOH:
      sz = readback_bytes(&part->state, buffer, bufsize, STRCONST("\r\n"),
                          STRCONST(""));
      if(!sz)
        mimesetstate(&part->state, MIMESTATE_BODY, NULL);
      break;
    case MIMESTATE_BODY:
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state, MIMESTATE_CONTENT, NULL);
      break;
    case MIMESTATE_CONTENT:
      if(part->encoder)
        sz = read_encoded_part_content(part, buffer, bufsize, hasread);
      else
        sz = read_part_content(part, buffer, bufsize, hasread);
      switch(sz) {
      case 0:
        mimesetstate(&part->state, MIMESTATE_END, NULL);
        /* Try sparing open file descriptors. */
        if(part->kind == MIMEKIND_FILE && part->fp) {
          fclose(part->fp);
          part->fp = NULL;
        }
        FALLTHROUGH();
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
      case STOP_FILLING:
        return cursize? cursize: sz;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* Other values not in part state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    bufsize -= sz;
  }

  return cursize;
}